

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  file_time_type fVar5;
  istream *piVar6;
  size_t sVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  char *pcVar10;
  uint32_t lineno;
  int iVar11;
  ulong __new_size;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileName;
  pointer __source;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  ifstream configFile;
  string local_268;
  thread local_240;
  path local_238 [13];
  
  bVar2 = CommandLineOptions::parse(&g_Options,argc,argv);
  if (!bVar2) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,g_Options.errorMessage._M_dataplus._M_p,
                        g_Options.errorMessage._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    return 1;
  }
  switch(g_Options.platform) {
  case UNKNOWN:
    pcVar10 = "UNKNOWN";
    break;
  case DXBC:
    pcVar10 = "DXBC";
    break;
  case DXIL:
    pcVar10 = "DXIL";
    break;
  case SPIRV:
    pcVar10 = "SPIR-V";
    break;
  default:
    goto switchD_0010b4d8_default;
  }
  std::__cxx11::string::_M_replace
            (0x13b9c0,0,(char *)g_PlatformName_abi_cxx11_._M_string_length,(ulong)pcVar10);
switchD_0010b4d8_default:
  pbVar1 = g_Options.ignoreFileNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (g_Options.ignoreFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      g_Options.ignoreFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __source = g_Options.ignoreFileNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (local_238,__source,auto_format);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      emplace_back<std::filesystem::__cxx11::path>(&g_IgnoreIncludes_abi_cxx11_,local_238);
      std::filesystem::__cxx11::path::~path(local_238);
      __source = __source + 1;
    } while (__source != pbVar1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (local_238,&g_Options.inputFile,auto_format);
  g_ConfigWriteTime.__d.__r = (duration)std::filesystem::last_write_time(local_238);
  std::filesystem::__cxx11::path::~path(local_238);
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (local_238,argv,auto_format);
  fVar5.__d.__r = (duration)std::filesystem::last_write_time(local_238);
  if ((long)fVar5.__d.__r < (long)g_ConfigWriteTime.__d.__r) {
    fVar5 = g_ConfigWriteTime;
  }
  g_ConfigWriteTime.__d.__r = fVar5.__d.__r;
  std::filesystem::__cxx11::path::~path(local_238);
  std::ifstream::ifstream(local_238,(string *)&g_Options,_S_in);
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  lineno = 1;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_pathname._M_dataplus._M_p + -0x18)
                            + (char)local_238);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_268,cVar3);
    uVar4 = *(uint *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18) + 0x20);
    if ((uVar4 & 5) != 0) break;
    bVar2 = trim(&local_268);
    if ((bVar2) && (bVar2 = expandPermutations(lineno,&local_268), !bVar2)) {
      iVar11 = 1;
      goto LAB_0010b6e7;
    }
    lineno = lineno + 1;
  }
  iVar11 = 0;
LAB_0010b6e7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((uVar4 & 5) != 0) {
    if (g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
        super__Vector_impl_data._M_start ==
        g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All ",4);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,g_PlatformName_abi_cxx11_._M_dataplus._M_p,
                          g_PlatformName_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," outputs are up to date.",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      iVar11 = 0;
      std::ostream::flush();
    }
    else {
      g_OriginalTaskCount =
           (int)((ulong)((long)g_CompileTasks.
                               super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)g_CompileTasks.
                              super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 5) * -0x33333333;
      LOCK();
      g_ProcessedTaskCount.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      UNLOCK();
      snprintf(main::envBuf,0x400,"COMPILER=%s",g_Options.compilerPath._M_dataplus._M_p);
      putenv(main::envBuf);
      if (g_Options.verbose == true) {
        sVar7 = strlen(main::envBuf);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,main::envBuf,sVar7)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
      }
      uVar4 = std::thread::hardware_concurrency();
      if ((uVar4 == 0) || (g_Options.parallel == false)) {
        uVar4 = 1;
      }
      signal(2,signal_handler);
      local_268._M_dataplus._M_p = (pointer)0x0;
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity = 0;
      __new_size = (ulong)uVar4;
      std::vector<std::thread,_std::allocator<std::thread>_>::resize
                ((vector<std::thread,_std::allocator<std::thread>_> *)&local_268,__new_size);
      uVar12 = 0;
      do {
        std::thread::thread<void(&)(),,void>(&local_240,compileThreadProc);
        if (*(long *)(local_268._M_dataplus._M_p + uVar12 * 8) != 0) {
          std::terminate();
        }
        ((id *)(local_268._M_dataplus._M_p + uVar12 * 8))->_M_thread =
             (native_handle_type)local_240._M_id._M_thread;
        uVar12 = uVar12 + 1;
      } while (__new_size != uVar12);
      do {
        std::thread::join();
        __new_size = __new_size - 1;
      } while (__new_size != 0);
      iVar11 = 1;
      if ((g_CompileSuccess != false) &&
         (p_Var8 = g_ShaderBlobs_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
         g_Terminate == false)) {
        for (; (_Rb_tree_header *)p_Var8 !=
               &g_ShaderBlobs_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          bVar2 = WriteShaderBlob((string *)(p_Var8 + 1),
                                  (vector<BlobEntry,_std::allocator<BlobEntry>_> *)(p_Var8 + 2));
          if (!bVar2) goto LAB_0010b8a1;
        }
        iVar11 = 0;
      }
LAB_0010b8a1:
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&local_268);
    }
  }
  std::ifstream::~ifstream(local_238);
  return iVar11;
}

Assistant:

int main(int argc, char** argv)
{
	if (!g_Options.parse(argc, argv))
	{
		cout << g_Options.errorMessage << endl;
		return 1;
	}

	switch (g_Options.platform)
	{
	case Platform::DXBC: g_PlatformName = "DXBC"; break;
	case Platform::DXIL: g_PlatformName = "DXIL"; break;
	case Platform::SPIRV: g_PlatformName = "SPIR-V"; break;
	case Platform::UNKNOWN: g_PlatformName = "UNKNOWN"; break; // never happens
	}

	for (const auto& fileName : g_Options.ignoreFileNames)
	{
		g_IgnoreIncludes.push_back(fileName);
	}
	
	g_ConfigWriteTime = fs::last_write_time(g_Options.inputFile);

	// Updated shaderCompiler executable also means everything must be recompiled
	g_ConfigWriteTime = std::max(g_ConfigWriteTime, fs::last_write_time(argv[0]));
	
	ifstream configFile(g_Options.inputFile);
	uint32_t lineno = 0;
	for(string line; getline(configFile, line);)
	{
		lineno++;

		if (!trim(line))
			continue;

		if (!expandPermutations(lineno, line))
			return 1;
	}

	if (g_CompileTasks.empty())
	{
		cout << "All " << g_PlatformName << " outputs are up to date." << endl;
		return 0;
	}

	g_OriginalTaskCount = (int)g_CompileTasks.size();
	g_ProcessedTaskCount = 0;

	{
		// Workaround for weird behavior of _popen / cmd.exe on Windows
		// with quotes around the executable name and also around some other arguments.

		static char envBuf[1024]; // use a static array because putenv uses it by reference
#ifdef WIN32
		snprintf(envBuf, sizeof(envBuf), "COMPILER=\"%s\"", g_Options.compilerPath.c_str());
#else
		snprintf(envBuf, sizeof(envBuf), "COMPILER=%s", g_Options.compilerPath.c_str());
#endif
		putenv(envBuf);
		
		if (g_Options.verbose)
		{
			cout << envBuf << endl;
		}
	}

	unsigned int threadCount = thread::hardware_concurrency();
	if (threadCount == 0 || !g_Options.parallel)
	{
		threadCount = 1;
	}

	signal(SIGINT, signal_handler);

	vector<thread> threads;
	threads.resize(threadCount);
	for (unsigned int threadIndex = 0; threadIndex < threadCount; threadIndex++)
	{
		threads[threadIndex] = thread(compileThreadProc);
	}
	for (unsigned int threadIndex = 0; threadIndex < threadCount; threadIndex++)
	{
		threads[threadIndex].join();
	}

	if (!g_CompileSuccess || g_Terminate)
		return 1;

	for (const pair<const string, vector<BlobEntry>>& it : g_ShaderBlobs)
	{
		if (!WriteShaderBlob(it.first, it.second))
			return 1;
	}

	return 0;
}